

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaNormalTargetGenerator.cxx
# Opt level: O2

void __thiscall
cmNinjaNormalTargetGenerator::WriteLinkRule
          (cmNinjaNormalTargetGenerator *this,bool useResponseFile,string *config)

{
  cmMakefile *pcVar1;
  cmGeneratorTarget *target;
  cmLocalNinjaGenerator *pcVar2;
  bool bVar3;
  cmGlobalNinjaGenerator *pcVar4;
  string *psVar5;
  string *psVar6;
  cmValue cVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  _Alloc_hider _Var9;
  string *linkCmd;
  pointer b;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  string_view source;
  string_view source_00;
  char local_7f9;
  string *local_7f8;
  TargetType local_7f0;
  char local_7e9;
  string lang;
  int minor;
  string linker;
  string responseFlag;
  cmRulePlaceholderExpander *local_768;
  string local_760;
  string launcher;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  linkCmds;
  string cmakeVarLang;
  string linkRuleName;
  string targetVersionMajor;
  string cmakeLinkVar;
  char *local_688;
  string val;
  string targetVersionMinor;
  cmNinjaRule slRule;
  char *local_518 [5];
  pointer local_4f0;
  string local_4e8;
  string langFlags;
  string local_4a8 [32];
  char local_488 [8];
  char *local_480;
  char local_468 [280];
  Names tgtNames;
  char local_250 [40];
  string local_228;
  string local_208;
  string local_1e8;
  string local_1c8;
  string linkerLauncher;
  string local_188 [32];
  char local_168 [32];
  string local_148 [280];
  
  local_7f0 = cmGeneratorTarget::GetType
                        ((this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.
                         GeneratorTarget);
  local_7f8 = config;
  LanguageLinkerRule(&linkRuleName,this,config);
  pcVar4 = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
  bVar3 = cmGlobalNinjaGenerator::HasRule(pcVar4,&linkRuleName);
  if (bVar3) goto LAB_00291525;
  local_4e8._M_dataplus._M_p = (pointer)&local_4e8.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)linkRuleName._M_dataplus._M_p == &linkRuleName.field_2) {
    local_4e8.field_2._8_8_ = linkRuleName.field_2._8_8_;
  }
  else {
    local_4e8._M_dataplus._M_p = linkRuleName._M_dataplus._M_p;
  }
  local_4e8._M_string_length = linkRuleName._M_string_length;
  linkRuleName._M_string_length = 0;
  linkRuleName.field_2._M_local_buf[0] = '\0';
  linkRuleName._M_dataplus._M_p = (pointer)&linkRuleName.field_2;
  cmNinjaRule::cmNinjaRule((cmNinjaRule *)&tgtNames,&local_4e8);
  std::__cxx11::string::~string((string *)&local_4e8);
  memset(&slRule,0,0x158);
  psVar5 = cmGeneratorTarget::GetName_abi_cxx11_
                     ((this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.
                      GeneratorTarget);
  slRule.Name._M_dataplus._M_p = (psVar5->_M_dataplus)._M_p;
  psVar6 = cmState::GetTargetTypeName_abi_cxx11_(local_7f0);
  psVar5 = local_7f8;
  slRule.Name._M_string_length = (size_type)(psVar6->_M_dataplus)._M_p;
  cmGeneratorTarget::GetLinkerTool
            (&linker,(this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.
                     GeneratorTarget,local_7f8);
  slRule.RspFile._M_dataplus = linker._M_dataplus;
  TargetLinkLanguage(&lang,this,psVar5);
  slRule.Command.field_2._M_allocated_capacity = (size_type)lang._M_dataplus._M_p;
  slRule.Command.field_2._8_8_ = anon_var_dwarf_9d02b9;
  bVar3 = cmLocalGenerator::IsSplitSwiftBuild
                    ((cmLocalGenerator *)(this->super_cmNinjaTargetGenerator).LocalGenerator);
  if (!bVar3) {
    TargetLinkLanguage(&langFlags,this,local_7f8);
    bVar3 = std::operator==(&langFlags,"Swift");
    std::__cxx11::string::~string((string *)&langFlags);
    if (bVar3) {
      slRule.Restat._M_string_length = (size_type)anon_var_dwarf_9d02df;
      slRule.Restat.field_2._M_allocated_capacity = (size_type)anon_var_dwarf_9d02eb;
      slRule.Restat.field_2._8_8_ = anon_var_dwarf_9d02f7;
      local_518[0] = "$SWIFT_SOURCES";
      slRule.RspContent._M_dataplus._M_p = "$DEFINES";
      slRule.DepFile.field_2._8_8_ = anon_var_dwarf_97b25d;
      slRule.RspContent._M_string_length = (size_type)anon_var_dwarf_97b1ed;
    }
  }
  responseFlag._M_dataplus._M_p = (pointer)&responseFlag.field_2;
  responseFlag._M_string_length = 0;
  responseFlag.field_2._M_local_buf[0] = '\0';
  TargetLinkLanguage(&langFlags,this,local_7f8);
  cmStrCat<char_const(&)[7],std::__cxx11::string>(&cmakeVarLang,(char (*) [7])0x6bfdfb,&langFlags);
  std::__cxx11::string::~string((string *)&langFlags);
  bVar3 = cmGeneratorTarget::HasLinkDependencyFile
                    ((this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.
                     GeneratorTarget,local_7f8);
  if (bVar3) {
    pcVar1 = (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.Makefile;
    cmStrCat<std::__cxx11::string&,char_const(&)[23]>
              (&langFlags,&cmakeVarLang,(char (*) [23])"_LINKER_DEPFILE_FORMAT");
    cmMakefile::GetDefinition(pcVar1,&langFlags);
    std::__cxx11::string::~string((string *)&langFlags);
    std::__cxx11::string::_M_assign((string *)&tgtNames.ImportLibrary);
    std::__cxx11::string::assign((char *)&tgtNames.ImportReal);
  }
  std::operator+(&cmakeLinkVar,&cmakeVarLang,"_RESPONSE_FILE_LINK_FLAG");
  cVar7 = cmMakefile::GetDefinition
                    ((this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.Makefile,
                     &cmakeLinkVar);
  if (cVar7.Value == (string *)0x0) {
    std::__cxx11::string::assign((char *)&responseFlag);
  }
  else {
    std::__cxx11::string::_M_assign((string *)&responseFlag);
  }
  if ((useResponseFile) && (responseFlag._M_string_length != 0)) {
    std::__cxx11::string::assign((char *)&tgtNames.PDB);
    std::__cxx11::string::append((string *)&responseFlag);
    cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
    std::__cxx11::string::assign((char *)&tgtNames.SharedObject);
    bVar3 = CheckUseResponseFileForLibraries(this,&lang);
    if (bVar3) {
      std::__cxx11::string::append((char *)&tgtNames.SharedObject);
      slRule.Description.field_2._M_allocated_capacity = (size_type)"";
    }
    else {
      slRule.Description.field_2._M_allocated_capacity = (size_type)"$LINK_PATH $LINK_LIBRARIES";
    }
    bVar3 = cmLocalGenerator::IsSplitSwiftBuild
                      ((cmLocalGenerator *)(this->super_cmNinjaTargetGenerator).LocalGenerator);
    if (!bVar3) {
      TargetLinkLanguage(&langFlags,this,local_7f8);
      bVar3 = std::operator==(&langFlags,"Swift");
      std::__cxx11::string::~string((string *)&langFlags);
      if (bVar3) {
        paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)local_518;
        _Var9 = responseFlag._M_dataplus;
        goto LAB_00290f2a;
      }
    }
    paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)&slRule.Description;
    _Var9._M_p = responseFlag._M_dataplus._M_p;
  }
  else {
    paVar8 = &slRule.Description.field_2;
    slRule.Description._M_dataplus._M_p = "$in";
    _Var9._M_p = "$LINK_PATH $LINK_LIBRARIES";
  }
LAB_00290f2a:
  paVar8->_M_allocated_capacity = (size_type)_Var9._M_p;
  slRule.DepFile._M_string_length = (size_type)anon_var_dwarf_97b211;
  slRule.Description._M_string_length = (long)" -E rm -f $TARGET_FILE" + 10;
  slRule.DepType._M_string_length = (size_type)anon_var_dwarf_9d00bf;
  slRule.DepType.field_2._M_allocated_capacity = (size_type)anon_var_dwarf_9d00cb;
  slRule.DepType.field_2._8_8_ = anon_var_dwarf_9d037f;
  slRule.Name.field_2._M_allocated_capacity = (size_type)anon_var_dwarf_97b1f9;
  targetVersionMajor._M_dataplus._M_p = (pointer)&targetVersionMajor.field_2;
  targetVersionMajor._M_string_length = 0;
  targetVersionMajor.field_2._M_local_buf[0] = '\0';
  targetVersionMinor._M_dataplus._M_p = (pointer)&targetVersionMinor.field_2;
  targetVersionMinor._M_string_length = 0;
  targetVersionMinor.field_2._M_local_buf[0] = '\0';
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&langFlags);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&linkerLauncher);
  cmGeneratorTarget::GetTargetVersion
            ((this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget,
             (int *)&val,&minor);
  std::ostream::operator<<(&langFlags,(int)val._M_dataplus._M_p);
  std::ostream::operator<<(&linkerLauncher,minor);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&targetVersionMajor,(string *)&launcher);
  std::__cxx11::string::~string((string *)&launcher);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&targetVersionMinor,(string *)&launcher);
  std::__cxx11::string::~string((string *)&launcher);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&linkerLauncher);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&langFlags);
  slRule.Command._M_dataplus = targetVersionMajor._M_dataplus;
  slRule.Command._M_string_length = (size_type)targetVersionMinor._M_dataplus._M_p;
  slRule.DepFile.field_2._8_8_ = anon_var_dwarf_97b25d;
  slRule.RspFile._M_string_length = (size_type)anon_var_dwarf_9d0117;
  langFlags._M_dataplus._M_p = (pointer)&langFlags.field_2;
  langFlags._M_string_length = 0;
  slRule.RspFile.field_2._M_allocated_capacity = (size_type)anon_var_dwarf_9d0123;
  langFlags.field_2._M_local_buf[0] = '\0';
  if (local_7f0 != EXECUTABLE) {
    std::__cxx11::string::append((char *)&langFlags);
    slRule.RspFile.field_2._8_8_ = langFlags._M_dataplus._M_p;
  }
  cmCommonTargetGenerator::GetLinkerLauncher
            (&linkerLauncher,(cmCommonTargetGenerator *)this,local_7f8);
  if (linkerLauncher._M_string_length != 0) {
    local_4f0 = linkerLauncher._M_dataplus._M_p;
  }
  launcher._M_dataplus._M_p = (pointer)&launcher.field_2;
  launcher._M_string_length = 0;
  launcher.field_2._M_local_buf[0] = '\0';
  target = (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget;
  pcVar2 = (this->super_cmNinjaTargetGenerator).LocalGenerator;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&minor,"RULE_LAUNCH_LINK",(allocator<char> *)&local_760);
  cmLocalGenerator::GetRuleLauncher
            (&val,(cmLocalGenerator *)pcVar2,target,(string *)&minor,local_7f8);
  std::__cxx11::string::~string((string *)&minor);
  if (val._M_string_length != 0) {
    local_760._M_dataplus._M_p._0_1_ = 0x20;
    cmStrCat<std::__cxx11::string&,char>((string *)&minor,&val,(char *)&local_760);
    std::__cxx11::string::operator=((string *)&launcher,(string *)&minor);
    std::__cxx11::string::~string((string *)&minor);
  }
  (*(((this->super_cmNinjaTargetGenerator).LocalGenerator)->super_cmLocalCommonGenerator).
    super_cmLocalGenerator.super_cmOutputConverter._vptr_cmOutputConverter[6])(&local_768);
  ComputeLinkCmd(&linkCmds,this,local_7f8);
  for (b = linkCmds.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      b != linkCmds.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish; b = b + 1) {
    cmStrCat<std::__cxx11::string&,std::__cxx11::string&>((string *)&minor,&launcher,b);
    std::__cxx11::string::operator=((string *)b,(string *)&minor);
    std::__cxx11::string::~string((string *)&minor);
    cmRulePlaceholderExpander::ExpandRuleVariables
              (local_768,(cmOutputConverter *)(this->super_cmNinjaTargetGenerator).LocalGenerator,b,
               (RuleVariables *)&slRule);
  }
  ::cm::
  erase_if<std::__cxx11::string,std::allocator<std::__cxx11::string>,cmNinjaRemoveNoOpCommands>
            (&linkCmds);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&minor,"$PRE_LINK",(allocator<char> *)&local_760);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_insert_rval(&linkCmds,
                   (const_iterator)
                   linkCmds.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,(value_type *)&minor);
  std::__cxx11::string::~string((string *)&minor);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[12]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&linkCmds,
             (char (*) [12])"$POST_BUILD");
  psVar5 = local_7f8;
  local_760._M_dataplus._M_p = (pointer)&local_760.field_2;
  local_760._M_string_length = 0;
  local_760.field_2._M_local_buf[0] = '\0';
  cmLocalNinjaGenerator::BuildCommandLine
            ((string *)&minor,(this->super_cmNinjaTargetGenerator).LocalGenerator,&linkCmds,
             local_7f8,local_7f8,&local_760,(cmGeneratorTarget *)0x0);
  std::__cxx11::string::operator=((string *)&tgtNames.Output,(string *)&minor);
  std::__cxx11::string::~string((string *)&minor);
  std::__cxx11::string::~string((string *)&local_760);
  TargetLinkLanguage(&local_760,this,psVar5);
  local_7f9 = ' ';
  local_688 = GetVisibleTypeName(this);
  local_7e9 = '.';
  cmStrCat<char_const(&)[18],std::__cxx11::string,char,char_const*,char>
            ((string *)&minor,(char (*) [18])"Rule for linking ",&local_760,&local_7f9,&local_688,
             &local_7e9);
  std::__cxx11::string::operator=((string *)&tgtNames.ImportOutput,(string *)&minor);
  std::__cxx11::string::~string((string *)&minor);
  std::__cxx11::string::~string((string *)&local_760);
  TargetLinkLanguage(&local_760,this,local_7f8);
  local_7f9 = ' ';
  local_688 = GetVisibleTypeName(this);
  cmStrCat<char_const(&)[9],std::__cxx11::string,char,char_const*,char_const(&)[14]>
            ((string *)&minor,(char (*) [9])"Linking ",&local_760,&local_7f9,&local_688,
             (char (*) [14])0x68d11f);
  std::__cxx11::string::operator=((string *)&tgtNames.Real,(string *)&minor);
  std::__cxx11::string::~string((string *)&minor);
  std::__cxx11::string::~string((string *)&local_760);
  std::__cxx11::string::assign(local_250);
  pcVar4 = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
  cmGlobalNinjaGenerator::AddRule(pcVar4,(cmNinjaRule *)&tgtNames);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&linkCmds);
  if (local_768 != (cmRulePlaceholderExpander *)0x0) {
    (*(local_768->super_cmPlaceholderExpander)._vptr_cmPlaceholderExpander[1])();
  }
  std::__cxx11::string::~string((string *)&val);
  std::__cxx11::string::~string((string *)&launcher);
  std::__cxx11::string::~string((string *)&linkerLauncher);
  std::__cxx11::string::~string((string *)&langFlags);
  std::__cxx11::string::~string((string *)&targetVersionMinor);
  std::__cxx11::string::~string((string *)&targetVersionMajor);
  std::__cxx11::string::~string((string *)&cmakeLinkVar);
  std::__cxx11::string::~string((string *)&cmakeVarLang);
  std::__cxx11::string::~string((string *)&responseFlag);
  std::__cxx11::string::~string((string *)&lang);
  std::__cxx11::string::~string((string *)&linker);
  cmNinjaRule::~cmNinjaRule((cmNinjaRule *)&tgtNames);
LAB_00291525:
  TargetNames(&tgtNames,this,local_7f8);
  bVar3 = std::operator!=(&tgtNames.Output,&tgtNames.Real);
  if ((bVar3) &&
     (bVar3 = cmGeneratorTarget::IsFrameworkOnApple
                        ((this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.
                         GeneratorTarget), !bVar3)) {
    pcVar2 = (this->super_cmNinjaTargetGenerator).LocalGenerator;
    psVar5 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
    source._M_str = (psVar5->_M_dataplus)._M_p;
    source._M_len = psVar5->_M_string_length;
    cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
              (&linkerLauncher,(cmOutputConverter *)pcVar2,source,SHELL,false);
    if (local_7f0 == EXECUTABLE) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1c8,"CMAKE_SYMLINK_EXECUTABLE",(allocator<char> *)&slRule);
      cmNinjaRule::cmNinjaRule((cmNinjaRule *)&langFlags,&local_1c8);
      std::__cxx11::string::~string((string *)&local_1c8);
      lang._M_dataplus._M_p = (pointer)0x0;
      lang._M_string_length = 0;
      lang.field_2._M_allocated_capacity = 0;
      std::operator+(&slRule.Name,&linkerLauncher," -E cmake_symlink_executable $in $out");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&lang,
                 &slRule.Name);
      std::__cxx11::string::~string((string *)&slRule);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const(&)[12]>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&lang,
                 (char (*) [12])"$POST_BUILD");
      linker._M_dataplus._M_p = (pointer)&linker.field_2;
      linker._M_string_length = 0;
      linker.field_2._M_local_buf[0] = '\0';
      cmLocalNinjaGenerator::BuildCommandLine
                (&slRule.Name,(this->super_cmNinjaTargetGenerator).LocalGenerator,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&lang,local_7f8,local_7f8,&linker,(cmGeneratorTarget *)0x0);
      std::__cxx11::string::operator=(local_4a8,(string *)&slRule);
      std::__cxx11::string::~string((string *)&slRule);
      std::__cxx11::string::~string((string *)&linker);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&lang);
      std::__cxx11::string::assign(local_488);
      std::__cxx11::string::assign(local_468);
      pcVar4 = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
      cmGlobalNinjaGenerator::AddRule(pcVar4,(cmNinjaRule *)&langFlags);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1e8,"CMAKE_SYMLINK_LIBRARY",(allocator<char> *)&slRule);
      cmNinjaRule::cmNinjaRule((cmNinjaRule *)&langFlags,&local_1e8);
      std::__cxx11::string::~string((string *)&local_1e8);
      lang._M_dataplus._M_p = (pointer)0x0;
      lang._M_string_length = 0;
      lang.field_2._M_allocated_capacity = 0;
      std::operator+(&slRule.Name,&linkerLauncher," -E cmake_symlink_library $in $SONAME $out");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&lang,
                 &slRule.Name);
      std::__cxx11::string::~string((string *)&slRule);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const(&)[12]>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&lang,
                 (char (*) [12])"$POST_BUILD");
      linker._M_dataplus._M_p = (pointer)&linker.field_2;
      linker._M_string_length = 0;
      linker.field_2._M_local_buf[0] = '\0';
      cmLocalNinjaGenerator::BuildCommandLine
                (&slRule.Name,(this->super_cmNinjaTargetGenerator).LocalGenerator,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&lang,local_7f8,local_7f8,&linker,(cmGeneratorTarget *)0x0);
      std::__cxx11::string::operator=(local_4a8,(string *)&slRule);
      std::__cxx11::string::~string((string *)&slRule);
      std::__cxx11::string::~string((string *)&linker);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&lang);
      std::__cxx11::string::assign(local_488);
      std::__cxx11::string::assign(local_468);
      pcVar4 = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
      cmGlobalNinjaGenerator::AddRule(pcVar4,(cmNinjaRule *)&langFlags);
    }
    cmNinjaRule::~cmNinjaRule((cmNinjaRule *)&langFlags);
    std::__cxx11::string::~string((string *)&linkerLauncher);
  }
  bVar3 = cmGeneratorTarget::IsApple
                    ((this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.
                     GeneratorTarget);
  if ((bVar3) &&
     (bVar3 = cmGeneratorTarget::HasImportLibrary
                        ((this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.
                         GeneratorTarget,local_7f8), bVar3)) {
    TextStubsGeneratorRule(&local_208,this,local_7f8);
    cmNinjaRule::cmNinjaRule((cmNinjaRule *)&linkerLauncher,&local_208);
    std::__cxx11::string::~string((string *)&local_208);
    slRule.Name._M_dataplus._M_p = GetVisibleTypeName(this);
    linker._M_dataplus._M_p._0_1_ = 0x2e;
    cmStrCat<char_const(&)[42],char_const*,char>
              (&langFlags,(char (*) [42])"Rule for generating text-based stubs for ",
               (char **)&slRule,(char *)&linker);
    std::__cxx11::string::operator=(local_148,(string *)&langFlags);
    std::__cxx11::string::~string((string *)&langFlags);
    std::__cxx11::string::assign(local_168);
    pcVar1 = (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.Makefile;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&langFlags,"CMAKE_CREATE_TEXT_STUBS",(allocator<char> *)&slRule);
    psVar5 = (string *)cmMakefile::GetDefinition(pcVar1,&langFlags);
    if (psVar5 == (string *)0x0) {
      psVar5 = &cmValue::Empty_abi_cxx11_;
    }
    std::__cxx11::string::string((string *)&linker,(string *)psVar5);
    std::__cxx11::string::~string((string *)&langFlags);
    (*(((this->super_cmNinjaTargetGenerator).LocalGenerator)->super_cmLocalCommonGenerator).
      super_cmLocalGenerator.super_cmOutputConverter._vptr_cmOutputConverter[6])(&launcher);
    memset(&langFlags,0,0x158);
    _Var9 = launcher._M_dataplus;
    local_480 = "$in";
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&slRule,"$out",(allocator<char> *)&lang);
    std::__cxx11::string::_M_assign((string *)(_Var9._M_p + 8));
    std::__cxx11::string::~string((string *)&slRule);
    cmRulePlaceholderExpander::ExpandRuleVariables
              ((cmRulePlaceholderExpander *)launcher._M_dataplus._M_p,
               (cmOutputConverter *)(this->super_cmNinjaTargetGenerator).LocalGenerator,&linker,
               (RuleVariables *)&langFlags);
    pcVar2 = (this->super_cmNinjaTargetGenerator).LocalGenerator;
    std::__cxx11::string::string((string *)&lang,(string *)&linker);
    __l._M_len = 1;
    __l._M_array = &lang;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&cmakeVarLang,__l,(allocator_type *)&cmakeLinkVar);
    responseFlag._M_dataplus._M_p = (pointer)&responseFlag.field_2;
    responseFlag._M_string_length = 0;
    responseFlag.field_2._M_local_buf[0] = '\0';
    cmLocalNinjaGenerator::BuildCommandLine
              (&slRule.Name,pcVar2,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&cmakeVarLang,local_7f8,local_7f8,&responseFlag,(cmGeneratorTarget *)0x0);
    std::__cxx11::string::operator=(local_188,(string *)&slRule);
    std::__cxx11::string::~string((string *)&slRule);
    std::__cxx11::string::~string((string *)&responseFlag);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&cmakeVarLang);
    std::__cxx11::string::~string((string *)&lang);
    pcVar4 = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
    cmGlobalNinjaGenerator::AddRule(pcVar4,(cmNinjaRule *)&linkerLauncher);
    bVar3 = std::operator!=(&tgtNames.ImportOutput,&tgtNames.ImportReal);
    if ((bVar3) &&
       (bVar3 = cmGeneratorTarget::IsFrameworkOnApple
                          ((this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.
                           GeneratorTarget), !bVar3)) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_228,"CMAKE_SYMLINK_IMPORT_LIBRARY",(allocator<char> *)&lang);
      cmNinjaRule::cmNinjaRule(&slRule,&local_228);
      std::__cxx11::string::~string((string *)&local_228);
      pcVar2 = (this->super_cmNinjaTargetGenerator).LocalGenerator;
      psVar5 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
      source_00._M_str = (psVar5->_M_dataplus)._M_p;
      source_00._M_len = psVar5->_M_string_length;
      cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
                (&lang,(cmOutputConverter *)pcVar2,source_00,SHELL,false);
      cmStrCat<std::__cxx11::string&,char_const(&)[43]>
                (&responseFlag,&lang,(char (*) [43])" -E cmake_symlink_library $in $SONAME $out");
      pcVar2 = (this->super_cmNinjaTargetGenerator).LocalGenerator;
      std::__cxx11::string::string((string *)&cmakeLinkVar,(string *)&responseFlag);
      __l_00._M_len = 1;
      __l_00._M_array = &cmakeLinkVar;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&targetVersionMinor,__l_00,(allocator_type *)&val);
      targetVersionMajor._M_dataplus._M_p = (pointer)&targetVersionMajor.field_2;
      targetVersionMajor._M_string_length = 0;
      targetVersionMajor.field_2._M_local_buf[0] = '\0';
      cmLocalNinjaGenerator::BuildCommandLine
                (&cmakeVarLang,pcVar2,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&targetVersionMinor,local_7f8,local_7f8,&targetVersionMajor,
                 (cmGeneratorTarget *)0x0);
      std::__cxx11::string::operator=((string *)&slRule.Command,(string *)&cmakeVarLang);
      std::__cxx11::string::~string((string *)&cmakeVarLang);
      std::__cxx11::string::~string((string *)&targetVersionMajor);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&targetVersionMinor);
      std::__cxx11::string::~string((string *)&cmakeLinkVar);
      std::__cxx11::string::~string((string *)&responseFlag);
      std::__cxx11::string::~string((string *)&lang);
      std::__cxx11::string::assign((char *)&slRule.Description);
      std::__cxx11::string::assign((char *)&slRule.Comment);
      pcVar4 = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
      cmGlobalNinjaGenerator::AddRule(pcVar4,&slRule);
      cmNinjaRule::~cmNinjaRule(&slRule);
    }
    if (launcher._M_dataplus._M_p != (pointer)0x0) {
      (**(code **)(*(long *)launcher._M_dataplus._M_p + 8))();
    }
    std::__cxx11::string::~string((string *)&linker);
    cmNinjaRule::~cmNinjaRule((cmNinjaRule *)&linkerLauncher);
  }
  cmGeneratorTarget::Names::~Names(&tgtNames);
  std::__cxx11::string::~string((string *)&linkRuleName);
  return;
}

Assistant:

void cmNinjaNormalTargetGenerator::WriteLinkRule(bool useResponseFile,
                                                 const std::string& config)
{
  cmStateEnums::TargetType targetType = this->GetGeneratorTarget()->GetType();

  std::string linkRuleName = this->LanguageLinkerRule(config);
  if (!this->GetGlobalGenerator()->HasRule(linkRuleName)) {
    cmNinjaRule rule(std::move(linkRuleName));
    cmRulePlaceholderExpander::RuleVariables vars;
    vars.CMTargetName = this->GetGeneratorTarget()->GetName().c_str();
    vars.CMTargetType = cmState::GetTargetTypeName(targetType).c_str();

    std::string linker = this->GetGeneratorTarget()->GetLinkerTool(config);
    vars.Linker = linker.c_str();
    std::string lang = this->TargetLinkLanguage(config);
    vars.Language = lang.c_str();
    vars.AIXExports = "$AIX_EXPORTS";

    if (!this->GetLocalGenerator()->IsSplitSwiftBuild() &&
        this->TargetLinkLanguage(config) == "Swift") {
      vars.SwiftLibraryName = "$SWIFT_LIBRARY_NAME";
      vars.SwiftModule = "$SWIFT_MODULE";
      vars.SwiftModuleName = "$SWIFT_MODULE_NAME";
      vars.SwiftSources = "$SWIFT_SOURCES";

      vars.Defines = "$DEFINES";
      vars.Flags = "$FLAGS";
      vars.Includes = "$INCLUDES";
    }

    std::string responseFlag;

    std::string cmakeVarLang =
      cmStrCat("CMAKE_", this->TargetLinkLanguage(config));

    if (this->GeneratorTarget->HasLinkDependencyFile(config)) {
      auto DepFileFormat = this->GetMakefile()->GetDefinition(
        cmStrCat(cmakeVarLang, "_LINKER_DEPFILE_FORMAT"));
      rule.DepType = DepFileFormat;
      rule.DepFile = "$DEP_FILE";
    }

    // build response file name
    std::string cmakeLinkVar = cmakeVarLang + "_RESPONSE_FILE_LINK_FLAG";
    cmValue flag = this->GetMakefile()->GetDefinition(cmakeLinkVar);

    if (flag) {
      responseFlag = *flag;
    } else {
      responseFlag = "@";
    }

    if (!useResponseFile || responseFlag.empty()) {
      vars.Objects = "$in";
      vars.LinkLibraries = "$LINK_PATH $LINK_LIBRARIES";
    } else {
      rule.RspFile = "$RSP_FILE";
      responseFlag += rule.RspFile;

      // build response file content
      if (this->GetGlobalGenerator()->IsGCCOnWindows()) {
        rule.RspContent = "$in";
      } else {
        rule.RspContent = "$in_newline";
      }

      // If libraries in rsp is enable
      if (this->CheckUseResponseFileForLibraries(lang)) {
        rule.RspContent += " $LINK_PATH $LINK_LIBRARIES";
        vars.LinkLibraries = "";
      } else {
        vars.LinkLibraries = "$LINK_PATH $LINK_LIBRARIES";
      }

      if (!this->GetLocalGenerator()->IsSplitSwiftBuild() &&
          this->TargetLinkLanguage(config) == "Swift") {
        vars.SwiftSources = responseFlag.c_str();
      } else {
        vars.Objects = responseFlag.c_str();
      }
    }

    vars.ObjectDir = "$OBJECT_DIR";

    vars.Target = "$TARGET_FILE";

    vars.SONameFlag = "$SONAME_FLAG";
    vars.TargetSOName = "$SONAME";
    vars.TargetInstallNameDir = "$INSTALLNAME_DIR";
    vars.TargetPDB = "$TARGET_PDB";

    // Setup the target version.
    std::string targetVersionMajor;
    std::string targetVersionMinor;
    {
      std::ostringstream majorStream;
      std::ostringstream minorStream;
      int major;
      int minor;
      this->GetGeneratorTarget()->GetTargetVersion(major, minor);
      majorStream << major;
      minorStream << minor;
      targetVersionMajor = majorStream.str();
      targetVersionMinor = minorStream.str();
    }
    vars.TargetVersionMajor = targetVersionMajor.c_str();
    vars.TargetVersionMinor = targetVersionMinor.c_str();

    vars.Flags = "$FLAGS";
    vars.LinkFlags = "$LINK_FLAGS";
    vars.Manifests = "$MANIFESTS";

    std::string langFlags;
    if (targetType != cmStateEnums::EXECUTABLE) {
      langFlags += "$LANGUAGE_COMPILE_FLAGS $ARCH_FLAGS";
      vars.LanguageCompileFlags = langFlags.c_str();
    }

    std::string linkerLauncher = this->GetLinkerLauncher(config);
    if (cmNonempty(linkerLauncher)) {
      vars.Launcher = linkerLauncher.c_str();
    }

    std::string launcher;
    std::string val = this->GetLocalGenerator()->GetRuleLauncher(
      this->GetGeneratorTarget(), "RULE_LAUNCH_LINK", config);
    if (cmNonempty(val)) {
      launcher = cmStrCat(val, ' ');
    }

    auto rulePlaceholderExpander =
      this->GetLocalGenerator()->CreateRulePlaceholderExpander();

    // Rule for linking library/executable.
    std::vector<std::string> linkCmds = this->ComputeLinkCmd(config);
    for (std::string& linkCmd : linkCmds) {
      linkCmd = cmStrCat(launcher, linkCmd);
      rulePlaceholderExpander->ExpandRuleVariables(this->GetLocalGenerator(),
                                                   linkCmd, vars);
    }

    // If there is no ranlib the command will be ":".  Skip it.
    cm::erase_if(linkCmds, cmNinjaRemoveNoOpCommands());

    linkCmds.insert(linkCmds.begin(), "$PRE_LINK");
    linkCmds.emplace_back("$POST_BUILD");
    rule.Command =
      this->GetLocalGenerator()->BuildCommandLine(linkCmds, config, config);

    // Write the linker rule with response file if needed.
    rule.Comment =
      cmStrCat("Rule for linking ", this->TargetLinkLanguage(config), ' ',
               this->GetVisibleTypeName(), '.');
    rule.Description =
      cmStrCat("Linking ", this->TargetLinkLanguage(config), ' ',
               this->GetVisibleTypeName(), " $TARGET_FILE");
    rule.Restat = "$RESTAT";
    this->GetGlobalGenerator()->AddRule(rule);
  }

  auto const tgtNames = this->TargetNames(config);
  if (tgtNames.Output != tgtNames.Real &&
      !this->GetGeneratorTarget()->IsFrameworkOnApple()) {
    std::string cmakeCommand =
      this->GetLocalGenerator()->ConvertToOutputFormat(
        cmSystemTools::GetCMakeCommand(), cmOutputConverter::SHELL);
    if (targetType == cmStateEnums::EXECUTABLE) {
      cmNinjaRule rule("CMAKE_SYMLINK_EXECUTABLE");
      {
        std::vector<std::string> cmd;
        cmd.push_back(cmakeCommand + " -E cmake_symlink_executable $in $out");
        cmd.emplace_back("$POST_BUILD");
        rule.Command =
          this->GetLocalGenerator()->BuildCommandLine(cmd, config, config);
      }
      rule.Description = "Creating executable symlink $out";
      rule.Comment = "Rule for creating executable symlink.";
      this->GetGlobalGenerator()->AddRule(rule);
    } else {
      cmNinjaRule rule("CMAKE_SYMLINK_LIBRARY");
      {
        std::vector<std::string> cmd;
        cmd.push_back(cmakeCommand +
                      " -E cmake_symlink_library $in $SONAME $out");
        cmd.emplace_back("$POST_BUILD");
        rule.Command =
          this->GetLocalGenerator()->BuildCommandLine(cmd, config, config);
      }
      rule.Description = "Creating library symlink $out";
      rule.Comment = "Rule for creating library symlink.";
      this->GetGlobalGenerator()->AddRule(rule);
    }
  }

  if (this->GetGeneratorTarget()->IsApple() &&
      this->GetGeneratorTarget()->HasImportLibrary(config)) {
    cmNinjaRule rule(this->TextStubsGeneratorRule(config));
    rule.Comment = cmStrCat("Rule for generating text-based stubs for ",
                            this->GetVisibleTypeName(), '.');
    rule.Description = "Creating text-based stubs $out";

    std::string cmd =
      this->GetMakefile()->GetDefinition("CMAKE_CREATE_TEXT_STUBS");
    auto rulePlaceholderExpander =
      this->GetLocalGenerator()->CreateRulePlaceholderExpander();
    cmRulePlaceholderExpander::RuleVariables vars;
    vars.Target = "$in";
    rulePlaceholderExpander->SetTargetImpLib("$out");
    rulePlaceholderExpander->ExpandRuleVariables(this->GetLocalGenerator(),
                                                 cmd, vars);

    rule.Command =
      this->GetLocalGenerator()->BuildCommandLine({ cmd }, config, config);
    this->GetGlobalGenerator()->AddRule(rule);

    if (tgtNames.ImportOutput != tgtNames.ImportReal &&
        !this->GetGeneratorTarget()->IsFrameworkOnApple()) {
      cmNinjaRule slRule("CMAKE_SYMLINK_IMPORT_LIBRARY");
      {
        std::string cmakeCommand =
          this->GetLocalGenerator()->ConvertToOutputFormat(
            cmSystemTools::GetCMakeCommand(), cmOutputConverter::SHELL);
        std::string slCmd =
          cmStrCat(cmakeCommand, " -E cmake_symlink_library $in $SONAME $out");
        slRule.Command = this->GetLocalGenerator()->BuildCommandLine(
          { slCmd }, config, config);
      }
      slRule.Description = "Creating import library symlink $out";
      slRule.Comment = "Rule for creating import library symlink.";
      this->GetGlobalGenerator()->AddRule(slRule);
    }
  }
}